

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkt-proc-builder.cpp
# Opt level: O3

void __thiscall yactfr::internal::PktProcBuilder::_insertEndInstrs(PktProcBuilder *this)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_> *erProc;
  _Hash_node_base *p_Var4;
  
  insertEndInstr<yactfr::internal::EndPktPreambleProcInstr>
            (&((this->_pktProc)._M_t.
               super___uniq_ptr_impl<yactfr::internal::PktProc,_std::default_delete<yactfr::internal::PktProc>_>
               ._M_t.
               super__Tuple_impl<0UL,_yactfr::internal::PktProc_*,_std::default_delete<yactfr::internal::PktProc>_>
               .super__Head_base<0UL,_yactfr::internal::PktProc_*,_false>._M_head_impl)->
              _preambleProc);
  for (p_Var2 = ((__node_base *)
                ((long)&(((this->_pktProc)._M_t.
                          super___uniq_ptr_impl<yactfr::internal::PktProc,_std::default_delete<yactfr::internal::PktProc>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_yactfr::internal::PktProc_*,_std::default_delete<yactfr::internal::PktProc>_>
                          .super__Head_base<0UL,_yactfr::internal::PktProc_*,_false>._M_head_impl)->
                        _dsPktProcs)._M_h + 0x10))->_M_nxt; p_Var2 != (_Hash_node_base *)0x0;
      p_Var2 = p_Var2->_M_nxt) {
    insertEndInstr<yactfr::internal::EndDsPktPreambleProcInstr>((Proc *)(p_Var2[2]._M_nxt + 1));
    insertEndInstr<yactfr::internal::EndDsErPreambleProcInstr>((Proc *)(p_Var2[2]._M_nxt + 7));
    p_Var3 = p_Var2[2]._M_nxt;
    p_Var1 = p_Var3[0xf]._M_nxt;
    for (p_Var4 = p_Var3[0xe]._M_nxt; p_Var4 != p_Var1; p_Var4 = p_Var4 + 1) {
      if (p_Var4->_M_nxt != (_Hash_node_base *)0x0) {
        insertEndInstr<yactfr::internal::EndErProcInstr>((Proc *)(p_Var4->_M_nxt + 1));
      }
    }
    for (p_Var3 = p_Var3[0x13]._M_nxt; p_Var3 != (_Hash_node_base *)0x0; p_Var3 = p_Var3->_M_nxt) {
      insertEndInstr<yactfr::internal::EndErProcInstr>((Proc *)(p_Var3[2]._M_nxt + 1));
    }
  }
  return;
}

Assistant:

void PktProcBuilder::_insertEndInstrs()
{
    insertEndInstr<EndPktPreambleProcInstr>(_pktProc->preambleProc());

    for (auto& dsPktProcPair : _pktProc->dsPktProcs()) {
        auto& dsPktProc = dsPktProcPair.second;

        insertEndInstr<EndDsPktPreambleProcInstr>(dsPktProc->pktPreambleProc());
        insertEndInstr<EndDsErPreambleProcInstr>(dsPktProc->erPreambleProc());

        dsPktProc->forEachErProc([](ErProc& erProc) {
            insertEndInstr<EndErProcInstr>(erProc.proc());
        });
    }
}